

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O3

void __thiscall GibbsSamplerFromHDP::deleteK(GibbsSamplerFromHDP *this,uint k)

{
  pointer puVar1;
  pointer pvVar2;
  long lVar3;
  ulong uVar4;
  pointer puVar5;
  pointer puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = this->_J;
  if (uVar8 != 0) {
    puVar1 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar2 = (this->_kjt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      uVar7 = puVar1[uVar4];
      if (uVar7 != 0) {
        lVar3 = *(long *)&pvVar2[uVar4].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        uVar9 = 0;
        do {
          uVar8 = *(uint *)(lVar3 + uVar9 * 4);
          if (k < uVar8) {
            *(uint *)(lVar3 + uVar9 * 4) = uVar8 - 1;
            uVar7 = puVar1[uVar4];
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar7);
        uVar8 = this->_J;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar8);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_erase(&this->_nkv,
             (this->_nkv).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + k);
  puVar1 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = puVar1 + (ulong)k + 1;
  if (puVar6 != puVar5) {
    memmove(puVar1 + k,puVar6,(long)puVar5 - (long)puVar6);
    puVar5 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar5 + -1;
  puVar1 = (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = puVar1 + (ulong)k + 1;
  if (puVar6 != puVar5) {
    memmove(puVar1 + k,puVar6,(long)puVar5 - (long)puVar6);
    puVar5 = (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar5 + -1;
  this->_K = this->_K - 1;
  return;
}

Assistant:

void GibbsSamplerFromHDP::deleteK(unsigned int k){//{{{
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            if(_kjt[j][t] > k) _kjt[j][t]--;
        }
    }
    _nkv.erase(_nkv.begin() + k);
    _nk.erase(_nk.begin() + k);
    _mk.erase(_mk.begin() + k);
    _K--;
}